

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect.cpp
# Opt level: O0

void alGenEffects(ALsizei n,ALuint *effects)

{
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
  __last;
  bool bVar1;
  undefined1 uVar2;
  ALCcontext *pAVar3;
  ALeffect *pAVar4;
  const_iterator __first;
  ALuint *in_RSI;
  uint in_EDI;
  char *pcVar5;
  ALeffect *effect_1;
  vector<ALuint> ids;
  ALeffect *effect;
  lock_guard<std::mutex> _;
  ALCdevice *device;
  ContextRef context;
  mutex_type *in_stack_ffffffffffffff68;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *this;
  ALeffect *in_stack_ffffffffffffff70;
  uint *__args;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff98;
  vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *in_stack_ffffffffffffffa0;
  ALCdevice *in_stack_ffffffffffffffa8;
  ALCdevice *in_stack_ffffffffffffffb0;
  intrusive_ptr<ALCcontext> local_18;
  ALuint *local_10;
  uint local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)&local_18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((int)local_4 < 0) {
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      ALCcontext::setError(pAVar3,0xa003,"Generating %d effects",(ulong)local_4);
    }
    if (0 < (int)local_4) {
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
      al::intrusive_ptr<ALCdevice>::get(&pAVar3->mDevice);
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      uVar2 = anon_unknown.dwarf_1c62b::EnsureEffects
                        (in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
      if ((bool)uVar2) {
        if (local_4 == 1) {
          pAVar4 = anon_unknown.dwarf_1c62b::AllocEffect(in_stack_ffffffffffffffb0);
          *local_10 = pAVar4->id;
        }
        else {
          __args = (uint *)&stack0xffffffffffffffa8;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::vector
                    ((vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)0x14d8eb);
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          do {
            in_stack_ffffffffffffff70 =
                 anon_unknown.dwarf_1c62b::AllocEffect(in_stack_ffffffffffffffb0);
            std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::emplace_back<unsigned_int&>
                      (in_stack_ffffffffffffff80,__args);
            local_4 = local_4 - 1;
          } while (local_4 != 0);
          this = (vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_> *)&stack0xffffffffffffffa8
          ;
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cbegin(this);
          __first = std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::cend(this);
          __last._M_current._7_1_ = uVar2;
          __last._M_current._0_7_ = in_stack_ffffffffffffff88;
          std::
          copy<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>>,unsigned_int*>
                    ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>_>
                      )__first._M_current,__last,(uint *)in_stack_ffffffffffffff80);
          std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~vector
                    (in_stack_ffffffffffffff80);
        }
      }
      else {
        pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_18);
        pcVar5 = "s";
        if (local_4 == 1) {
          pcVar5 = "";
        }
        ALCcontext::setError(pAVar3,0xa005,"Failed to allocate %d effect%s",(ulong)local_4,pcVar5);
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14d9bc);
    }
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenEffects(ALsizei n, ALuint *effects)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d effects", n);
    if UNLIKELY(n <= 0) return;

    ALCdevice *device{context->mDevice.get()};
    std::lock_guard<std::mutex> _{device->EffectLock};
    if(!EnsureEffects(device, static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d effect%s", n, (n==1)?"":"s");
        return;
    }

    if LIKELY(n == 1)
    {
        /* Special handling for the easy and normal case. */
        ALeffect *effect{AllocEffect(device)};
        effects[0] = effect->id;
    }
    else
    {
        /* Store the allocated buffer IDs in a separate local list, to avoid
         * modifying the user storage in case of failure.
         */
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALeffect *effect{AllocEffect(device)};
            ids.emplace_back(effect->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), effects);
    }